

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

void re_alternate_onto(re_context *ctx,re_machine *dest,re_machine *rhs)

{
  int iVar1;
  re_machine *in_RDX;
  re_context *in_RSI;
  re_context *in_RDI;
  re_machine new_machine;
  re_machine *in_stack_ffffffffffffffd8;
  errcxdef *in_stack_ffffffffffffffe0;
  
  iVar1 = re_is_machine_null(in_RDI,(re_machine *)in_RSI);
  if (iVar1 == 0) {
    iVar1 = re_is_machine_null(in_RDI,in_RDX);
    if (iVar1 == 0) {
      re_build_alter(in_RSI,in_RDX,(re_machine *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8
                    );
      in_RSI->errctx = in_stack_ffffffffffffffe0;
    }
  }
  else {
    in_RSI->errctx = (errcxdef *)*in_RDX;
  }
  return;
}

Assistant:

static void re_alternate_onto(re_context *ctx,
                              re_machine *dest, re_machine *rhs)
{
    /* check to see if the first machine is null */
    if (re_is_machine_null(ctx, dest))
    {
        /* 
         *   the first machine is null - simply copy the second machine
         *   onto the first 
         */
        *dest = *rhs;
    }
    else
    {
        /* 
         *   if the second machine is null, don't do anything; otherwise,
         *   build the alternation 
         */
        if (!re_is_machine_null(ctx, rhs))
        {
            re_machine new_machine;
            
            /* build the alternation */
            re_build_alter(ctx, &new_machine, dest, rhs);

            /* replace the first machine with the alternation */
            *dest = new_machine;
        }
    }
}